

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

bool makePattern(CHAR8 *textPattern,vector<unsigned_char,_std::allocator<unsigned_char>_> *pattern,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *patternMask)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong __new_size;
  UINTN i;
  ulong uVar8;
  
  sVar5 = strlen(textPattern);
  if ((sVar5 & 1) == 0 && sVar5 != 0) {
    __new_size = sVar5 >> 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pattern,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(patternMask,__new_size);
    uVar8 = 0;
    do {
      iVar4 = toupper((int)textPattern[uVar8 * 2]);
      cVar2 = (char)iVar4;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar7 = (int)cVar2 - 0x30;
      }
      else if ((byte)(cVar2 + 0xbfU) < 6) {
        uVar7 = (int)cVar2 - 0x37;
      }
      else {
        uVar7 = ~(uint)(cVar2 == '.');
      }
      iVar4 = toupper((int)textPattern[uVar8 * 2 + 1]);
      cVar2 = (char)iVar4;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar6 = (int)cVar2 - 0x30;
      }
      else if ((byte)(cVar2 + 0xbfU) < 6) {
        uVar6 = (int)cVar2 - 0x37;
      }
      else {
        uVar6 = ~(uint)(cVar2 == '.');
      }
      bVar3 = uVar6 != 0xffffffff && uVar7 != 0xffffffff;
      if (uVar6 == 0xffffffff || uVar7 == 0xffffffff) {
        return bVar3;
      }
      if (uVar7 != 0xfffffffe) {
        (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] = 0xf0;
        (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] = (char)uVar7 << 4;
      }
      if (uVar6 != 0xfffffffe) {
        pbVar1 = (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar8;
        *pbVar1 = *pbVar1 | 0xf;
        pbVar1 = (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar8;
        *pbVar1 = *pbVar1 | (byte)uVar6;
      }
      uVar8 = uVar8 + 1;
    } while (__new_size != uVar8);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool makePattern(const CHAR8 *textPattern, std::vector<UINT8> &pattern, std::vector<UINT8> &patternMask)
{
    UINTN len = std::strlen(textPattern);
    
    if (len == 0 || len % 2 != 0)
        return false;
    
    len /= 2;
    
    pattern.resize(len);
    patternMask.resize(len);
    
    for (UINTN i = 0; i < len; i++) {
        int v1 = char2hex(std::toupper(textPattern[i * 2]));
        int v2 = char2hex(std::toupper(textPattern[i * 2 + 1]));
        
        if (v1 == -1 || v2 == -1)
            return false;
        
        if (v1 != -2) {
            patternMask[i] = 0xF0;
            pattern[i] = static_cast<UINT8>(v1) << 4;
        }
        
        if (v2 != -2) {
            patternMask[i] |= 0x0F;
            pattern[i] |= static_cast<UINT8>(v2);
        }
    }
    
    return true;
}